

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O2

void lightconf::config_format::write_group(scanner *sc,writer *wr,bool braces,group *gr)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  return_type<lightconf::value> pvVar5;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pointer pbVar6;
  pointer pbVar7;
  ulong uVar8;
  bool bVar9;
  allocator local_1ad;
  int local_1ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  scanner dummy_scanner;
  string key_1;
  char local_d8;
  value local_c8;
  
  bVar2 = true;
  local_1ac = (int)CONCAT71(in_register_00000011,braces);
  if (local_1ac != 0) {
    iVar4 = group_length(gr,0x78);
    iVar1 = wr->wrap_length;
    bVar2 = iVar1 < iVar4;
    std::__cxx11::string::string((string *)&dummy_scanner,"{ ",(allocator *)&key_1);
    writer::append(wr,&dummy_scanner.input_);
    std::__cxx11::string::~string((string *)&dummy_scanner);
    writer::indent(wr);
    if (iVar1 < iVar4) {
      writer::newline(wr);
    }
    scanner::expect(sc,'{',false);
  }
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar7 = (gr->order_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (gr->order_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar7; pbVar6 = pbVar6 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&keys,pbVar6);
  }
LAB_00114b17:
  do {
    scanner::peek_token((token *)&dummy_scanner,sc);
    bVar9 = (int)dummy_scanner.input_._M_dataplus._M_p != 7;
    if ((bVar9 & (byte)local_1ac) == 1) {
      scanner::peek_token((token *)&key_1,sc);
      bVar9 = local_d8 != '}' || (int)key_1._M_dataplus._M_p != 4;
      std::__cxx11::string::~string((string *)&key_1._M_string_length);
    }
    std::__cxx11::string::~string((string *)&dummy_scanner.input_._M_string_length);
    if (!bVar9) break;
    scanner::expect_identifier_abi_cxx11_(&key_1,sc);
    scanner::expect(sc,'=',false);
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (keys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            keys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(token *)&key_1);
    if (__position._M_current ==
        keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      read_value(&local_c8,sc);
      value::~value(&local_c8);
    }
    else {
      writer::append(wr,&key_1);
      std::__cxx11::string::string((string *)&dummy_scanner," = ",&local_1ad);
      writer::append(wr,&dummy_scanner.input_);
      std::__cxx11::string::~string((string *)&dummy_scanner);
      path::path((path *)&dummy_scanner,__position._M_current,'.');
      pvVar5 = group::get<lightconf::value>(gr,(path *)&dummy_scanner);
      write_value(sc,wr,pvVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dummy_scanner);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&keys,(const_iterator)__position._M_current);
      scanner::peek_token((token *)&dummy_scanner,sc);
      pbVar7 = keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar6 = keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((int)dummy_scanner.input_._M_dataplus._M_p == 4) &&
         ((char)dummy_scanner.tokens_.
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == '}')) {
        std::__cxx11::string::~string((string *)&dummy_scanner.input_._M_string_length);
        if (pbVar6 != pbVar7) goto LAB_00114ca9;
        if (bVar2) goto LAB_00114ce1;
        std::__cxx11::string::string((string *)&dummy_scanner," ",&local_1ad);
        writer::append(wr,&dummy_scanner.input_);
      }
      else {
        std::__cxx11::string::~string((string *)&dummy_scanner.input_._M_string_length);
LAB_00114ca9:
        if (bVar2) {
          writer::newline(wr);
          goto LAB_00114ce1;
        }
        std::__cxx11::string::string((string *)&dummy_scanner,", ",&local_1ad);
        writer::append(wr,&dummy_scanner.input_);
      }
      std::__cxx11::string::~string((string *)&dummy_scanner);
    }
LAB_00114ce1:
    scanner::expect(sc,',',true);
    if ((byte)local_1ac == '\0') {
      std::__cxx11::string::~string((string *)&key_1);
      goto LAB_00114b17;
    }
    scanner::peek_token((token *)&dummy_scanner,sc);
    cVar3 = (char)dummy_scanner.tokens_.
                  super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    iVar1 = (int)dummy_scanner.input_._M_dataplus._M_p;
    std::__cxx11::string::~string((string *)&dummy_scanner.input_._M_string_length);
    std::__cxx11::string::~string((string *)&key_1);
  } while ((iVar1 != 4) || (cVar3 != '}'));
  pbVar6 = keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0;
  pbVar7 = keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar7 == pbVar6) {
      if ((byte)local_1ac != '\0') {
        std::deque<int,_std::allocator<int>_>::pop_back(&(wr->tabstops).c);
        if (bVar2) {
          writer::newline(wr);
        }
        scanner::expect(sc,'}',false);
        std::__cxx11::string::string((string *)&dummy_scanner,"}",(allocator *)&key_1);
        writer::append(wr,&dummy_scanner.input_);
        std::__cxx11::string::~string((string *)&dummy_scanner);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&keys);
      return;
    }
    writer::append(wr,pbVar7);
    std::__cxx11::string::string((string *)&dummy_scanner," = ",(allocator *)&key_1);
    writer::append(wr,&dummy_scanner.input_);
    std::__cxx11::string::~string((string *)&dummy_scanner);
    std::__cxx11::string::string((string *)&key_1,"0",&local_1ad);
    make_scanner(&dummy_scanner,&key_1);
    std::__cxx11::string::~string((string *)&key_1);
    path::path((path *)&key_1,pbVar7,'.');
    pvVar5 = group::get<lightconf::value>(gr,(path *)&key_1);
    write_value(&dummy_scanner,wr,pvVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&key_1);
    if (uVar8 < ((long)keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      if (bVar2) {
        writer::newline(wr);
      }
      else {
        std::__cxx11::string::string((string *)&key_1,", ",&local_1ad);
        writer::append(wr,&key_1);
LAB_00114e63:
        std::__cxx11::string::~string((string *)&key_1);
      }
    }
    else if (!bVar2) {
      std::__cxx11::string::string((string *)&key_1," ",&local_1ad);
      writer::append(wr,&key_1);
      goto LAB_00114e63;
    }
    uVar8 = (ulong)((int)uVar8 + 1);
    scanner::~scanner(&dummy_scanner);
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

inline void write_group(scanner& sc, writer& wr, bool braces, const group& gr) {
    bool wrap = !braces || group_length(gr) > wr.wrap_length;

    if (braces) {
        wr.append("{ ");
        wr.indent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('{');
    }

    std::vector<std::string> keys;
    for (const auto& key : gr) {
        keys.push_back(key);
    }

    while (sc.peek_token().type != token_type::eof_token && !(braces && sc.peek_token().is_char('}'))) {
        std::string key = sc.expect_identifier();
        sc.expect('=');

        auto key_it = std::find(std::begin(keys), std::end(keys), key);
        if (key_it != keys.end()) {
            wr.append(key);
            wr.append(" = ");
            write_value(sc, wr, gr.get<value>(*key_it));
            keys.erase(key_it);
            bool terminate = sc.peek_token().is_char('}') && keys.empty();
            if (!terminate) {
                if (wrap) {
                    wr.newline();
                } else {
                    wr.append(", ");
                }
            } else if (!wrap) {
                wr.append(" ");
            }
        } else {
            read_value(sc);
        }

        sc.expect(',', true);
        if (braces && sc.peek_token().is_char('}')) {
            break;
        }
    }

    unsigned int i = 0;
    for (const auto& key : keys) {
        wr.append(key);
        wr.append(" = ");
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, gr.get<value>(key));
        if (i < keys.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        i++;
    }

    if (braces) {
        wr.unindent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('}');
        wr.append("}");
    }
}